

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::ShowMetricsWindow::Funcs::NodeDrawList
               (ImGuiWindow *window,ImDrawList *draw_list,char *label)

{
  ulong uVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ImDrawList *pIVar9;
  ImDrawVert *pIVar10;
  char *pcVar11;
  uint *puVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  ImGuiContext *g;
  char *pcVar16;
  ImDrawList *draw_list_00;
  ImDrawCmd *pIVar17;
  int n;
  long lVar18;
  float fVar19;
  ImDrawCmd *local_1e0;
  ImGuiListClipper clipper;
  ImVec2 local_190;
  ImVec2 triangle_1 [3];
  char buf [300];
  undefined1 local_3c [12];
  
  pcVar16 = "";
  if (draw_list->_OwnerName != (char *)0x0) {
    pcVar16 = draw_list->_OwnerName;
  }
  uVar15 = (ulong)(uint)(draw_list->IdxBuffer).Size;
  bVar4 = TreeNode(draw_list,"%s: \'%s\' %d vtx, %d indices, %d cmds","DrawList",pcVar16,
                   (ulong)(uint)(draw_list->VtxBuffer).Size,uVar15,(draw_list->CmdBuffer).Size);
  pIVar3 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->WriteAccessed = true;
  if (pIVar2->DrawList == draw_list) {
    SameLine(0.0,-1.0);
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = -0x80;
    buf[3] = '?';
    buf[4] = -0x33;
    buf[5] = -0x34;
    buf[6] = -0x34;
    buf[7] = '>';
    buf[8] = -0x33;
    buf[9] = -0x34;
    buf[10] = -0x34;
    buf[0xb] = '>';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = -0x80;
    buf[0xf] = '?';
    TextColored((ImVec4 *)buf,"CURRENTLY APPENDING");
    if (!bVar4) {
      return;
    }
  }
  else {
    if (window == (ImGuiWindow *)0x0) {
      if (!bVar4) {
        return;
      }
    }
    else {
      bVar5 = IsItemHovered(0);
      if (bVar5) {
        buf._0_4_ = (window->Size).x + (window->Pos).x;
        buf._4_4_ = (window->Size).y + (window->Pos).y;
        ImDrawList::AddRect(&pIVar3->ForegroundDrawList,&window->Pos,(ImVec2 *)buf,0xff00ffff,0.0,
                            0xf,1.0);
      }
      if (!bVar4) {
        return;
      }
      if (window->WasActive == false) {
        TextDisabled("Warning: owning Window is inactive. This DrawList is not being rendered!");
      }
    }
    pIVar9 = (ImDrawList *)(draw_list->CmdBuffer).Data;
    local_1e0 = (ImDrawCmd *)0x0;
    for (draw_list_00 = pIVar9;
        draw_list_00 <
        (ImDrawList *)((long)&pIVar9->CmdBuffer + (long)(draw_list->CmdBuffer).Size * 0x38);
        draw_list_00 = (ImDrawList *)&draw_list_00->_Data) {
      pIVar10 = (draw_list_00->VtxBuffer).Data;
      iVar6 = (int)local_1e0;
      if (pIVar10 == (ImDrawVert *)0x0) {
        uVar14 = (draw_list_00->CmdBuffer).Size;
        if (uVar14 != 0) {
          if ((draw_list->IdxBuffer).Size < 1) {
            puVar12 = (uint *)0x0;
          }
          else {
            puVar12 = (draw_list->IdxBuffer).Data;
          }
          ImFormatString(buf,300,
                         "DrawCmd: %4d triangles, Tex 0x%p, ClipRect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
                         SUB84((double)(float)(draw_list_00->CmdBuffer).Capacity,0),
                         (double)*(float *)&(draw_list_00->CmdBuffer).Data,
                         (double)*(float *)((long)&(draw_list_00->CmdBuffer).Data + 4),
                         (double)(float)(draw_list_00->IdxBuffer).Size,(ulong)uVar14 / 3,
                         (draw_list_00->IdxBuffer).Data);
          bVar4 = TreeNode((void *)(((long)draw_list_00 - (long)(draw_list->CmdBuffer).Data) / 0x38)
                           ,"%s",buf);
          bVar5 = IsItemHovered(0);
          if ((bVar5) && (((show_drawcmd_mesh | show_drawcmd_aabb) & 1U) != 0)) {
            NodeDrawCmdShowMeshAndBoundingBox
                      ((ImGuiWindow *)draw_list,draw_list_00,local_1e0,(uint)show_drawcmd_mesh,
                       (bool)((~show_drawcmd_mesh | show_drawcmd_aabb) & 1),SUB81(uVar15,0));
          }
          if (bVar4) {
            fVar19 = 0.0;
            for (pIVar17 = local_1e0; (uint)pIVar17 < (uint)(iVar6 + (draw_list_00->CmdBuffer).Size)
                ; pIVar17 = (ImDrawCmd *)((long)&pIVar17->ElemCount + 3)) {
              clipper.DisplayStart = 0;
              clipper.DisplayEnd = 0;
              clipper.ItemsCount = 0;
              clipper.StepNo = 0;
              clipper.ItemsHeight = 0.0;
              clipper.StartPosY = 0.0;
              for (lVar18 = 0; lVar18 != 3; lVar18 = lVar18 + 1) {
                uVar15 = (long)&pIVar17->ElemCount + lVar18;
                uVar14 = (uint)uVar15;
                if (puVar12 != (uint *)0x0) {
                  uVar14 = puVar12[uVar15 & 0xffffffff];
                }
                pIVar10 = ImVector<ImDrawVert>::operator[](&draw_list->VtxBuffer,uVar14);
                *(ImVec2 *)(&clipper.DisplayStart + lVar18 * 2) = pIVar10->pos;
              }
              fVar19 = fVar19 + ABS(((float)clipper.DisplayEnd - (float)clipper.StepNo) *
                                    clipper.ItemsHeight +
                                    ((float)clipper.StepNo - clipper.StartPosY) *
                                    (float)clipper.DisplayStart +
                                    (clipper.StartPosY - (float)clipper.DisplayEnd) *
                                    (float)clipper.ItemsCount) * 0.5;
            }
            uVar15 = (ulong)(uint)(draw_list_00->VtxBuffer).Capacity;
            ImFormatString(buf,300,
                           "Mesh: ElemCount: %d, VtxOffset: +%d, IdxOffset: +%d, Area: ~%0.f px",
                           SUB84((double)fVar19,0));
            clipper.DisplayStart = 0;
            clipper.DisplayEnd = 0;
            Selectable(buf,false,0,(ImVec2 *)&clipper);
            bVar4 = IsItemHovered(0);
            if (bVar4) {
              NodeDrawCmdShowMeshAndBoundingBox
                        ((ImGuiWindow *)draw_list,draw_list_00,local_1e0,1,false,SUB81(uVar15,0));
            }
            clipper.ItemsCount = (uint)(draw_list_00->CmdBuffer).Size / 3;
            clipper.StartPosY = (GImGui->CurrentWindow->DC).CursorPos.y;
            clipper.StepNo = 0;
            clipper.ItemsHeight = -1.0;
            clipper.DisplayStart = -1;
            clipper.DisplayEnd = -1;
            while (bVar4 = ImGuiListClipper::Step(&clipper), bVar4) {
              uVar13 = (ulong)(uint)(clipper.DisplayStart * 3 + iVar6);
              for (iVar8 = clipper.DisplayStart; iVar8 < clipper.DisplayEnd; iVar8 = iVar8 + 1) {
                triangle_1[0].x = 0.0;
                triangle_1[0].y = 0.0;
                triangle_1[1].x = 0.0;
                triangle_1[1].y = 0.0;
                triangle_1[2].x = 0.0;
                triangle_1[2].y = 0.0;
                pcVar16 = buf;
                for (lVar18 = 0; lVar18 != 3; lVar18 = lVar18 + 1) {
                  uVar1 = lVar18 + (uVar13 & 0xffffffff);
                  uVar14 = (uint)uVar1;
                  if (puVar12 != (uint *)0x0) {
                    uVar14 = puVar12[(int)uVar13 + lVar18];
                  }
                  pIVar10 = ImVector<ImDrawVert>::operator[](&draw_list->VtxBuffer,uVar14);
                  triangle_1[lVar18] = pIVar10->pos;
                  pcVar11 = "     ";
                  if (lVar18 == 0) {
                    pcVar11 = "Vert:";
                  }
                  uVar15 = (ulong)pIVar10->col;
                  iVar7 = ImFormatString(pcVar16,(size_t)(local_3c + -(long)pcVar16),
                                         "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n",
                                         SUB84((double)(pIVar10->pos).x,0),(double)(pIVar10->pos).y,
                                         (double)(pIVar10->uv).x,(double)(pIVar10->uv).y,pcVar11,
                                         uVar1 & 0xffffffff);
                  pcVar16 = pcVar16 + iVar7;
                }
                local_190.x = 0.0;
                local_190.y = 0.0;
                Selectable(buf,false,0,&local_190);
                bVar4 = IsItemHovered(0);
                if (bVar4) {
                  uVar14 = (pIVar3->ForegroundDrawList).Flags;
                  (pIVar3->ForegroundDrawList).Flags = uVar14 & 0xfffffffe;
                  ImDrawList::AddPolyline
                            (&pIVar3->ForegroundDrawList,triangle_1,3,0xff00ffff,true,1.0);
                  (pIVar3->ForegroundDrawList).Flags = uVar14;
                }
                uVar13 = (uVar13 & 0xffffffff) + 3;
              }
            }
            TreePop();
            ImGuiListClipper::~ImGuiListClipper(&clipper);
          }
        }
      }
      else {
        BulletText("Callback %p, user_data %p",pIVar10,*(undefined8 *)&draw_list_00->Flags);
      }
      local_1e0 = (ImDrawCmd *)(ulong)(uint)(iVar6 + (draw_list_00->CmdBuffer).Size);
      pIVar9 = (ImDrawList *)(draw_list->CmdBuffer).Data;
    }
  }
  TreePop();
  return;
}

Assistant:

static void NodeDrawList(ImGuiWindow* window, ImDrawList* draw_list, const char* label)
        {
            bool node_open = ImGui::TreeNode(draw_list, "%s: '%s' %d vtx, %d indices, %d cmds", label, draw_list->_OwnerName ? draw_list->_OwnerName : "", draw_list->VtxBuffer.Size, draw_list->IdxBuffer.Size, draw_list->CmdBuffer.Size);
            if (draw_list == ImGui::GetWindowDrawList())
            {
                ImGui::SameLine();
                ImGui::TextColored(ImVec4(1.0f,0.4f,0.4f,1.0f), "CURRENTLY APPENDING"); // Can't display stats for active draw list! (we don't have the data double-buffered)
                if (node_open) ImGui::TreePop();
                return;
            }

            ImDrawList* fg_draw_list = GetForegroundDrawList(window); // Render additional visuals into the top-most draw list
            if (window && IsItemHovered())
                fg_draw_list->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
            if (!node_open)
                return;

            if (window && !window->WasActive)
                ImGui::TextDisabled("Warning: owning Window is inactive. This DrawList is not being rendered!");

            unsigned int elem_offset = 0;
            for (const ImDrawCmd* pcmd = draw_list->CmdBuffer.begin(); pcmd < draw_list->CmdBuffer.end(); elem_offset += pcmd->ElemCount, pcmd++)
            {
                if (pcmd->UserCallback == NULL && pcmd->ElemCount == 0)
                    continue;
                if (pcmd->UserCallback)
                {
                    ImGui::BulletText("Callback %p, user_data %p", pcmd->UserCallback, pcmd->UserCallbackData);
                    continue;
                }

                ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;
                char buf[300];
                ImFormatString(buf, IM_ARRAYSIZE(buf), "DrawCmd: %4d triangles, Tex 0x%p, ClipRect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
                    pcmd->ElemCount/3, (void*)(intptr_t)pcmd->TextureId,
                    pcmd->ClipRect.x, pcmd->ClipRect.y, pcmd->ClipRect.z, pcmd->ClipRect.w);
                bool pcmd_node_open = ImGui::TreeNode((void*)(pcmd - draw_list->CmdBuffer.begin()), "%s", buf);
                if (ImGui::IsItemHovered() && (show_drawcmd_mesh || show_drawcmd_aabb) && fg_draw_list)
                    NodeDrawCmdShowMeshAndBoundingBox(window, draw_list, pcmd, elem_offset, show_drawcmd_mesh, show_drawcmd_aabb);
                if (!pcmd_node_open)
                    continue;

                // Calculate approximate coverage area (touched pixel count)
                // This will be in pixels squared as long there's no post-scaling happening to the renderer output.
                float total_area = 0.0f;
                for (unsigned int base_idx = elem_offset; base_idx < (elem_offset + pcmd->ElemCount); base_idx += 3)
                {
                    ImVec2 triangle[3];
                    for (int n = 0; n < 3; n++)
                        triangle[n] = draw_list->VtxBuffer[idx_buffer ? idx_buffer[base_idx + n] : (base_idx + n)].pos;
                    total_area += ImTriangleArea(triangle[0], triangle[1], triangle[2]);
                }

                // Display vertex information summary. Hover to get all triangles drawn in wire-frame
                ImFormatString(buf, IM_ARRAYSIZE(buf), "Mesh: ElemCount: %d, VtxOffset: +%d, IdxOffset: +%d, Area: ~%0.f px", pcmd->ElemCount, pcmd->VtxOffset, pcmd->IdxOffset, total_area);
                ImGui::Selectable(buf);
                if (ImGui::IsItemHovered() && fg_draw_list)
                    NodeDrawCmdShowMeshAndBoundingBox(window, draw_list, pcmd, elem_offset, true, false);

                // Display individual triangles/vertices. Hover on to get the corresponding triangle highlighted.
                ImGuiListClipper clipper(pcmd->ElemCount/3); // Manually coarse clip our print out of individual vertices to save CPU, only items that may be visible.
                while (clipper.Step())
                    for (int prim = clipper.DisplayStart, idx_i = elem_offset + clipper.DisplayStart*3; prim < clipper.DisplayEnd; prim++)
                    {
                        char *buf_p = buf, *buf_end = buf + IM_ARRAYSIZE(buf);
                        ImVec2 triangle[3];
                        for (int n = 0; n < 3; n++, idx_i++)
                        {
                            ImDrawVert& v = draw_list->VtxBuffer[idx_buffer ? idx_buffer[idx_i] : idx_i];
                            triangle[n] = v.pos;
                            buf_p += ImFormatString(buf_p, buf_end - buf_p, "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n",
                                (n == 0) ? "Vert:" : "     ", idx_i, v.pos.x, v.pos.y, v.uv.x, v.uv.y, v.col);
                        }

                        ImGui::Selectable(buf, false);
                        if (fg_draw_list && ImGui::IsItemHovered())
                        {
                            ImDrawListFlags backup_flags = fg_draw_list->Flags;
                            fg_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines is more readable for very large and thin triangles.
                            fg_draw_list->AddPolyline(triangle, 3, IM_COL32(255,255,0,255), true, 1.0f);
                            fg_draw_list->Flags = backup_flags;
                        }
                    }
                ImGui::TreePop();
            }
            ImGui::TreePop();
        }